

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandFxch(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  uint local_40;
  uint local_3c;
  int fVeryVerbose;
  int fVerbose;
  int nMaxDivExt;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  fVeryVerbose = 0;
  local_3c = 0;
  local_40 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"Nvwh");
      if (iVar1 == -1) {
        if (pNtk_00 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Empty network.\n");
          return 1;
        }
        iVar1 = Abc_NtkNodeNum(pNtk_00);
        if (iVar1 == 0) {
          Abc_Print(-1,"The network does not have internal nodes.\n");
          return 1;
        }
        iVar1 = Abc_NtkIsLogic(pNtk_00);
        if (iVar1 == 0) {
          Abc_Print(-1,
                    "Fast extract can only be applied to a logic network (run \"renode\" or \"if\").\n"
                   );
          return 1;
        }
        iVar1 = Abc_NtkIsSopLogic(pNtk_00);
        if (iVar1 == 0) {
          Abc_Print(-1,
                    "Fast extract can only be applied to a logic network with SOP local functions (run \"bdd; sop\").\n"
                   );
          return 1;
        }
        Abc_NtkFxchPerform(pNtk_00,fVeryVerbose,local_3c,local_40);
        return 0;
      }
      if (iVar1 == 0x4e) break;
      if (iVar1 == 0x68) goto LAB_0026743c;
      if (iVar1 == 0x76) {
        local_3c = local_3c ^ 1;
      }
      else {
        if (iVar1 != 0x77) goto LAB_0026743c;
        local_40 = local_40 ^ 1;
      }
    }
    if (argc <= globalUtilOptind) break;
    fVeryVerbose = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if (fVeryVerbose < 0) {
LAB_0026743c:
      Abc_Print(-2,"usage: fxch [-N <num>] [-svwh]\n");
      Abc_Print(-2,"\t           performs fast extract with cube hashing on the current network\n");
      Abc_Print(-2,
                "\t-N <num> : max number of divisors to extract during this run [default = unused]\n"
               );
      pcVar2 = "no";
      if (local_3c != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v       : print verbose information [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (local_40 != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-w       : print additional information [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      Abc_Print(-2,"\t\n");
      Abc_Print(-2,
                "\t           This command was contributed by Bruno Schmitt from UFRGS in May 2016.\n"
               );
      Abc_Print(-2,"\t           The author can be contacted as boschmitt at inf.ufrgs.br\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
  goto LAB_0026743c;
}

Assistant:

static int Abc_CommandFxch( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Abc_NtkFxchPerform( Abc_Ntk_t * pNtk, int nMaxDivExt, int fVerbose, int fVeryVerbose );
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);

    int c,
        nMaxDivExt = 0,
        fVerbose = 0,
        fVeryVerbose = 0;

    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "Nvwh")) != EOF )
    {
        switch (c)
        {
            case 'N':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                    goto usage;
                }
                nMaxDivExt = atoi( argv[globalUtilOptind] );
                globalUtilOptind++;

                if ( nMaxDivExt < 0 )
                    goto usage;
                break;

            case 'v':
                fVerbose ^= 1;
                break;

            case 'w':
                fVeryVerbose ^= 1;
                break;

            case 'h':
                goto usage;
                break;

            default:
                goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkNodeNum( pNtk ) == 0 )
    {
        Abc_Print( -1, "The network does not have internal nodes.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic( pNtk ) )
    {
        Abc_Print( -1, "Fast extract can only be applied to a logic network (run \"renode\" or \"if\").\n" );
        return 1;
    }
    if ( !Abc_NtkIsSopLogic( pNtk ) )
    {
        Abc_Print( -1, "Fast extract can only be applied to a logic network with SOP local functions (run \"bdd; sop\").\n" );
        return 1;
    }

    Abc_NtkFxchPerform( pNtk, nMaxDivExt, fVerbose, fVeryVerbose );

    return 0;

usage:
    Abc_Print( -2, "usage: fxch [-N <num>] [-svwh]\n");
    Abc_Print( -2, "\t           performs fast extract with cube hashing on the current network\n");
    Abc_Print( -2, "\t-N <num> : max number of divisors to extract during this run [default = unused]\n" );
    Abc_Print( -2, "\t-v       : print verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : print additional information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    Abc_Print( -2, "\t\n" );
    Abc_Print( -2, "\t           This command was contributed by Bruno Schmitt from UFRGS in May 2016.\n" );
    Abc_Print( -2, "\t           The author can be contacted as boschmitt at inf.ufrgs.br\n" );
    return 1;
}